

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coinselector_tests.cpp
# Opt level: O3

void __thiscall
wallet::coinselector_tests::check_max_selection_weight::test_method
          (check_max_selection_weight *this)

{
  long lVar1;
  readonly_property65 rVar2;
  readonly_property<bool> rVar3;
  T *pTVar4;
  set<std::shared_ptr<wallet::COutput>,_std::less<std::shared_ptr<wallet::COutput>_>,_std::allocator<std::shared_ptr<wallet::COutput>_>_>
  *psVar5;
  _Any_data *p_Var6;
  iterator pvVar7;
  NodeContext *pNVar8;
  iterator pvVar9;
  NodeContext *m_node;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  check_type cVar10;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  _Any_data local_578;
  code *local_568;
  code *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  char *local_548;
  char *local_540;
  char *local_538;
  char *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  char *local_508;
  char *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  char *local_4e8;
  char *local_4e0;
  _Any_data local_4d8;
  code *local_4c8;
  code *local_4c0;
  int local_4ac;
  undefined1 local_4a8 [16];
  undefined1 *local_498;
  char *local_490;
  undefined1 *local_488;
  undefined1 *local_480;
  char *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  _Any_data local_408;
  code *local_3f8;
  code *local_3f0;
  int max_weight;
  CAmount target;
  int *local_3d8;
  undefined **local_3d0;
  element_type *local_3c8;
  shared_count sStack_3c0;
  int **local_3b8;
  int *local_3b0;
  lazy_ostream local_3a8;
  undefined1 *local_398;
  lazy_ostream *local_390;
  char *local_388;
  char *local_380;
  assertion_result local_378;
  CoinSelectionParams local_360;
  Result<wallet::SelectionResult> result;
  FastRandomContext rand;
  CCoinControl cc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  target = 4950000000;
  CCoinControl::CCoinControl(&cc);
  FastRandomContext::FastRandomContext(&rand,false);
  local_360.change_output_size = 0x22;
  local_360.change_spend_size = 0x44;
  local_360.m_min_change_target = 1000000;
  local_360.min_viable_change = 0;
  local_360.m_change_fee = 0;
  local_360.m_cost_of_change = 0;
  local_360.m_effective_feerate.nSatoshisPerK = 0;
  local_360.m_long_term_feerate.nSatoshisPerK = 0;
  local_360.m_discard_feerate.nSatoshisPerK = 0;
  local_360.tx_noinputs_size = 0x2c;
  local_360.m_subtract_fee_outputs = false;
  local_360.m_avoid_partial_spends = false;
  local_360.m_include_unsafe_inputs = false;
  local_360.m_max_tx_weight.super__Optional_base<int,_true,_true>._M_payload.
  super__Optional_payload_base<int> =
       (_Optional_base<int,_true,_true>)(_Optional_payload<int,_true,_true,_true>)0x0;
  max_weight = 0x61948;
  p_Var6 = &local_408;
  local_408._M_unused._M_object = (void *)0x0;
  local_408._8_8_ = 0;
  local_3f0 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1446:36)>
              ::_M_invoke;
  local_3f8 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1446:36)>
              ::_M_manager;
  m_node = &(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
            super_BasicTestingSetup.m_node;
  pNVar8 = m_node;
  local_360.rng_fast = &rand;
  select_coins(&result,&target,&local_360,&cc,
               (function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var6,m_node);
  if (local_3f8 != (code *)0x0) {
    (*local_3f8)(&local_408,&local_408,__destroy_functor);
  }
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x7b1f64;
  file.m_end = (iterator)0x5b1;
  file.m_begin = (iterator)&local_418;
  msg.m_end = (iterator)pNVar8;
  msg.m_begin = (iterator)p_Var6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_428,msg);
  local_3c8 = (element_type *)0x0;
  sStack_3c0.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "result";
  local_4a8._8_8_ = "";
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_430 = "";
  pvVar7 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_390 = (lazy_ostream *)local_4a8;
  local_3d0._0_1_ =
       (class_property<bool>)
       (class_property<bool>)
       (result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
        super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
        super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
        super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index == '\x01');
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3d0,&local_3a8,1,0,WARN,_cVar10,(size_t)&local_438,0x5b1);
  boost::detail::shared_count::~shared_count(&sStack_3c0);
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x5b3;
  file_00.m_begin = (iterator)&local_448;
  msg_00.m_end = pvVar9;
  msg_00.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_458,
             msg_00);
  pTVar4 = util::Result<wallet::SelectionResult>::value(&result);
  psVar5 = SelectionResult::GetInputSet(pTVar4);
  _cVar10 = 0x7b2059;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)has_coin(psVar5,5000000000);
  local_3d0 = (undefined **)
              CONCAT71(local_3d0._1_7_,
                       rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_3c8 = (element_type *)0x0;
  sStack_3c0.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "has_coin(result->GetInputSet(), CAmount(50 * COIN))";
  local_4a8._8_8_ = "";
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_468 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_460 = "";
  pvVar7 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_390 = (lazy_ostream *)local_4a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3d0,&local_3a8,1,0,WARN,_cVar10,(size_t)&local_468,0x5b3);
  boost::detail::shared_count::~shared_count(&sStack_3c0);
  local_478 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_470 = "";
  local_488 = &boost::unit_test::basic_cstring<char_const>::null;
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x5b4;
  file_01.m_begin = (iterator)&local_478;
  msg_01.m_end = pvVar9;
  msg_01.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_488,
             msg_01);
  local_4a8._8_8_ = local_4a8._8_8_ & 0xffffffffffffff00;
  local_4a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_498 = boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  pTVar4 = util::Result<wallet::SelectionResult>::value(&result);
  local_4ac = pTVar4->m_weight;
  local_3b0 = &local_4ac;
  local_3d8 = &max_weight;
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_4ac <= max_weight);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_380 = "";
  local_390 = (lazy_ostream *)&local_3b0;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_3b8 = &local_3d8;
  local_3c8 = (element_type *)((ulong)local_3c8 & 0xffffffffffffff00);
  local_3d0 = &PTR__lazy_ostream_013890c8;
  sStack_3c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_4a8,1,5,REQUIRE,0xf5f0d0,(size_t)&local_388,0x5b4,
             &local_3a8,"max_weight",(assertion_result *)&local_3d0);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  p_Var6 = &local_4d8;
  local_4d8._M_unused._M_object = (void *)0x0;
  local_4d8._8_8_ = 0;
  local_4c0 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1472:36)>
              ::_M_invoke;
  local_4c8 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1472:36)>
              ::_M_manager;
  pNVar8 = m_node;
  select_coins(&result,&target,&local_360,&cc,
               (function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var6,m_node);
  if (local_4c8 != (code *)0x0) {
    (*local_4c8)(&local_4d8,&local_4d8,__destroy_functor);
  }
  local_4e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_4e0 = "";
  local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4f0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x5cc;
  file_02.m_begin = (iterator)&local_4e8;
  msg_02.m_end = (iterator)pNVar8;
  msg_02.m_begin = (iterator)p_Var6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_4f8,
             msg_02);
  pTVar4 = util::Result<wallet::SelectionResult>::value(&result);
  psVar5 = SelectionResult::GetInputSet(pTVar4);
  _cVar10 = 0x7b2328;
  rVar3.super_class_property<bool>.value = (class_property<bool>)has_coin(psVar5,0x5f5e10);
  local_3c8 = (element_type *)0x0;
  sStack_3c0.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "has_coin(result->GetInputSet(), CAmount(0.0625 * COIN))";
  local_4a8._8_8_ = "";
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_508 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_500 = "";
  pvVar7 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_390 = (lazy_ostream *)local_4a8;
  local_3d0._0_1_ = rVar3.super_class_property<bool>.value;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3d0,&local_3a8,1,0,WARN,_cVar10,(size_t)&local_508,0x5cc);
  boost::detail::shared_count::~shared_count(&sStack_3c0);
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x5cd;
  file_03.m_begin = (iterator)&local_518;
  msg_03.m_end = pvVar9;
  msg_03.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_528,
             msg_03);
  pTVar4 = util::Result<wallet::SelectionResult>::value(&result);
  psVar5 = SelectionResult::GetInputSet(pTVar4);
  _cVar10 = 0x7b2408;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)has_coin(psVar5,2500000);
  local_3d0 = (undefined **)
              CONCAT71(local_3d0._1_7_,
                       rVar2.super_readonly_property<bool>.super_class_property<bool>.value);
  local_3c8 = (element_type *)0x0;
  sStack_3c0.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "has_coin(result->GetInputSet(), CAmount(0.025 * COIN))";
  local_4a8._8_8_ = "";
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_538 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_530 = "";
  pvVar7 = (iterator)0x1;
  pvVar9 = (iterator)0x0;
  local_390 = (lazy_ostream *)local_4a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3d0,&local_3a8,1,0,WARN,_cVar10,(size_t)&local_538,0x5cd);
  boost::detail::shared_count::~shared_count(&sStack_3c0);
  local_548 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_540 = "";
  local_558 = &boost::unit_test::basic_cstring<char_const>::null;
  local_550 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x5ce;
  file_04.m_begin = (iterator)&local_548;
  msg_04.m_end = pvVar9;
  msg_04.m_begin = pvVar7;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_558,
             msg_04);
  local_4a8._8_8_ = local_4a8._8_8_ & 0xffffffffffffff00;
  local_4a8._0_8_ = &PTR__lazy_ostream_01388f08;
  local_498 = boost::unit_test::lazy_ostream::inst;
  local_490 = "";
  pTVar4 = util::Result<wallet::SelectionResult>::value(&result);
  local_4ac = pTVar4->m_weight;
  local_378.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_4ac <= max_weight);
  local_378.m_message.px = (element_type *)0x0;
  local_378.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_388 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_380 = "";
  local_3b0 = &local_4ac;
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013890c8;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_390 = (lazy_ostream *)&local_3b0;
  local_3d8 = &max_weight;
  local_3c8 = (element_type *)((ulong)local_3c8 & 0xffffffffffffff00);
  local_3d0 = &PTR__lazy_ostream_013890c8;
  sStack_3c0.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_3b8 = &local_3d8;
  boost::test_tools::tt_detail::report_assertion
            (&local_378,(lazy_ostream *)local_4a8,1,5,REQUIRE,0xf5f0d0,(size_t)&local_388,0x5ce,
             &local_3a8,"max_weight",(assertion_result *)&local_3d0);
  boost::detail::shared_count::~shared_count(&local_378.m_message.pn);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  p_Var6 = &local_578;
  local_578._M_unused._M_object = (void *)0x0;
  local_578._8_8_ = 0;
  local_560 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1497:36)>
              ::_M_invoke;
  local_568 = std::
              _Function_handler<wallet::CoinsResult_(wallet::CWallet_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp:1497:36)>
              ::_M_manager;
  select_coins(&result,&target,&local_360,&cc,
               (function<wallet::CoinsResult_(wallet::CWallet_&)> *)p_Var6,m_node);
  if (local_568 != (code *)0x0) {
    (*local_568)(&local_578,&local_578,__destroy_functor);
  }
  local_588 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar10 = 0x7b26aa;
  file_05.m_end = (iterator)0x5e5;
  file_05.m_begin = (iterator)&local_588;
  msg_05.m_end = (iterator)m_node;
  msg_05.m_begin = (iterator)p_Var6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_598,
             msg_05);
  local_3d0 = (undefined **)
              CONCAT71(local_3d0._1_7_,
                       result.m_variant.super__Variant_base<bilingual_str,_wallet::SelectionResult>.
                       super__Move_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_assign_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Move_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Copy_ctor_alias<bilingual_str,_wallet::SelectionResult>.
                       super__Variant_storage_alias<bilingual_str,_wallet::SelectionResult>._M_index
                       != '\x01');
  local_3c8 = (element_type *)0x0;
  sStack_3c0.pi_ = (sp_counted_base *)0x0;
  local_4a8._0_8_ = "!result";
  local_4a8._8_8_ = "";
  local_3a8.m_empty = false;
  local_3a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_01389048;
  local_398 = boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/test/coinselector_tests.cpp"
  ;
  local_5a0 = "";
  local_390 = (lazy_ostream *)local_4a8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_3d0,&local_3a8,1,0,WARN,_cVar10,(size_t)&local_5a8,0x5e5);
  boost::detail::shared_count::~shared_count(&sStack_3c0);
  std::__detail::__variant::_Variant_storage<false,_bilingual_str,_wallet::SelectionResult>::
  ~_Variant_storage((_Variant_storage<false,_bilingual_str,_wallet::SelectionResult> *)&result);
  ChaCha20::~ChaCha20(&rand.rng);
  std::
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_wallet::PreselectedInput>,_std::_Select1st<std::pair<const_COutPoint,_wallet::PreselectedInput>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_wallet::PreselectedInput>_>_>
  ::~_Rb_tree(&cc.m_selected._M_t);
  std::
  _Rb_tree<XOnlyPubKey,_std::pair<const_XOnlyPubKey,_TaprootBuilder>,_std::_Select1st<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>,_std::less<XOnlyPubKey>,_std::allocator<std::pair<const_XOnlyPubKey,_TaprootBuilder>_>_>
  ::~_Rb_tree(&cc.m_external_provider.tr_trees._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CKey>,_std::_Select1st<std::pair<const_CKeyID,_CKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CKey>_>_>
  ::~_Rb_tree(&cc.m_external_provider.keys._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>,_std::_Select1st<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_std::pair<CPubKey,_KeyOriginInfo>_>_>_>
  ::~_Rb_tree(&cc.m_external_provider.origins._M_t);
  std::
  _Rb_tree<CKeyID,_std::pair<const_CKeyID,_CPubKey>,_std::_Select1st<std::pair<const_CKeyID,_CPubKey>_>,_std::less<CKeyID>,_std::allocator<std::pair<const_CKeyID,_CPubKey>_>_>
  ::~_Rb_tree(&cc.m_external_provider.pubkeys._M_t);
  std::
  _Rb_tree<CScriptID,_std::pair<const_CScriptID,_CScript>,_std::_Select1st<std::pair<const_CScriptID,_CScript>_>,_std::less<CScriptID>,_std::allocator<std::pair<const_CScriptID,_CScript>_>_>
  ::~_Rb_tree(&cc.m_external_provider.scripts._M_t);
  std::__detail::__variant::
  _Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
  ::~_Variant_storage((_Variant_storage<false,_CNoDestination,_PubKeyDestination,_PKHash,_ScriptHash,_WitnessV0ScriptHash,_WitnessV0KeyHash,_WitnessV1Taproot,_PayToAnchor,_WitnessUnknown>
                       *)&cc);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(check_max_selection_weight)
{
    const CAmount target = 49.5L * COIN;
    CCoinControl cc;

    FastRandomContext rand;
    CoinSelectionParams cs_params{
        rand,
        /*change_output_size=*/34,
        /*change_spend_size=*/68,
        /*min_change_target=*/CENT,
        /*effective_feerate=*/CFeeRate(0),
        /*long_term_feerate=*/CFeeRate(0),
        /*discard_feerate=*/CFeeRate(0),
        /*tx_noinputs_size=*/10 + 34, // static header size + output size
        /*avoid_partial=*/false,
    };

    int max_weight = MAX_STANDARD_TX_WEIGHT - WITNESS_SCALE_FACTOR * (cs_params.tx_noinputs_size + cs_params.change_output_size);
    {
        // Scenario 1:
        // The actor starts with 1x 50.0 BTC and 1515x 0.033 BTC (~100.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // The 50.0 BTC output should be selected, because the transaction would otherwise be too large

        // Perform selection

        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }

                add_coin(available_coins, wallet, CAmount(50 * COIN), CFeeRate(0), 144, false, 0, true);
                return available_coins;
            },
            m_node);

        BOOST_CHECK(result);
        // Verify that the 50 BTC UTXO was selected, and result is below max_weight
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(50 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 2:

        // The actor starts with 400x 0.0625 BTC and 2000x 0.025 BTC (75.0 BTC total) unspent outputs
        // Then tries to spend 49.5 BTC
        // A combination of coins should be selected, such that the created transaction is not too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 400; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.0625 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                for (int j = 0; j < 2000; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.025 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.0625 * COIN)));
        BOOST_CHECK(has_coin(result->GetInputSet(), CAmount(0.025 * COIN)));
        BOOST_CHECK_LE(result->GetWeight(), max_weight);
    }

    {
        // Scenario 3:

        // The actor starts with 1515x 0.033 BTC (49.995 BTC total) unspent outputs
        // No results should be returned, because the transaction would be too large

        // Perform selection
        const auto result = select_coins(
            target, cs_params, cc, [&](CWallet& wallet) {
                CoinsResult available_coins;
                for (int j = 0; j < 1515; ++j) {
                    add_coin(available_coins, wallet, CAmount(0.033 * COIN), CFeeRate(0), 144, false, 0, true);
                }
                return available_coins;
            },
            m_node);

        // No results
        // 1515 inputs * 68 bytes = 103,020 bytes
        // 103,020 bytes * 4 = 412,080 weight, which is above the MAX_STANDARD_TX_WEIGHT of 400,000
        BOOST_CHECK(!result);
    }
}